

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx *cctx,ZSTD_cParameter param,int value)

{
  int iVar1;
  size_t sVar2;
  int value_local;
  ZSTD_cParameter param_local;
  ZSTD_CCtx *cctx_local;
  
  if (cctx->streamStage != zcss_init) {
    iVar1 = ZSTD_isUpdateAuthorized(param);
    if (iVar1 == 0) {
      return 0xffffffffffffffc4;
    }
    cctx->cParamsChanged = 1;
  }
  if ((((param != ZSTD_c_experimentalParam2) && (7 < param - ZSTD_c_compressionLevel)) &&
      (4 < param - ZSTD_c_enableLongDistanceMatching)) && (2 < param - ZSTD_c_contentSizeFlag)) {
    if (param == ZSTD_c_nbWorkers) {
      if ((value != 0) && (cctx->staticSize != 0)) {
        return 0xffffffffffffffd8;
      }
    }
    else if (((1 < param - ZSTD_c_jobSize) && (param != ZSTD_c_experimentalParam1)) &&
            (4 < param - ZSTD_c_experimentalParam3)) {
      return 0xffffffffffffffd8;
    }
  }
  sVar2 = ZSTD_CCtxParams_setParameter(&cctx->requestedParams,param,value);
  return sVar2;
}

Assistant:

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx* cctx, ZSTD_cParameter param, int value)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParameter (%i, %i)", (int)param, value);
    if (cctx->streamStage != zcss_init) {
        if (ZSTD_isUpdateAuthorized(param)) {
            cctx->cParamsChanged = 1;
        } else {
            RETURN_ERROR(stage_wrong);
    }   }

    switch(param)
    {
    case ZSTD_c_nbWorkers:
        RETURN_ERROR_IF((value!=0) && cctx->staticSize, parameter_unsupported,
                        "MT not compatible with static alloc");
        break;

    case ZSTD_c_compressionLevel:
    case ZSTD_c_windowLog:
    case ZSTD_c_hashLog:
    case ZSTD_c_chainLog:
    case ZSTD_c_searchLog:
    case ZSTD_c_minMatch:
    case ZSTD_c_targetLength:
    case ZSTD_c_strategy:
    case ZSTD_c_ldmHashRateLog:
    case ZSTD_c_format:
    case ZSTD_c_contentSizeFlag:
    case ZSTD_c_checksumFlag:
    case ZSTD_c_dictIDFlag:
    case ZSTD_c_forceMaxWindow:
    case ZSTD_c_forceAttachDict:
    case ZSTD_c_literalCompressionMode:
    case ZSTD_c_jobSize:
    case ZSTD_c_overlapLog:
    case ZSTD_c_rsyncable:
    case ZSTD_c_enableLongDistanceMatching:
    case ZSTD_c_ldmHashLog:
    case ZSTD_c_ldmMinMatch:
    case ZSTD_c_ldmBucketSizeLog:
    case ZSTD_c_targetCBlockSize:
    case ZSTD_c_srcSizeHint:
        break;

    default: RETURN_ERROR(parameter_unsupported);
    }
    return ZSTD_CCtxParams_setParameter(&cctx->requestedParams, param, value);
}